

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_algorithms.h
# Opt level: O1

void __thiscall
Labeling2D<(Connectivity2D)8,_false>::Labeling2D
          (Labeling2D<(Connectivity2D)8,_false> *this,
          unique_ptr<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_> *input,
          unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *output)

{
  YacclabTensorInput *pYVar1;
  YacclabTensorOutput2D *pYVar2;
  long *plVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  
  pYVar1 = &((input->_M_t).
             super___uniq_ptr_impl<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_>
             ._M_t.
             super__Tuple_impl<0UL,_YacclabTensorInput2D_*,_std::default_delete<YacclabTensorInput2D>_>
             .super__Head_base<0UL,_YacclabTensorInput2D_*,_false>._M_head_impl)->
            super_YacclabTensorInput;
  (input->_M_t).
  super___uniq_ptr_impl<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_>._M_t.
  super__Tuple_impl<0UL,_YacclabTensorInput2D_*,_std::default_delete<YacclabTensorInput2D>_>.
  super__Head_base<0UL,_YacclabTensorInput2D_*,_false>._M_head_impl = (YacclabTensorInput2D *)0x0;
  pYVar2 = (output->_M_t).
           super___uniq_ptr_impl<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_>
           ._M_t.
           super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>
           .super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl;
  (output->_M_t).
  super___uniq_ptr_impl<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_>._M_t.
  super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>.
  super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl = (YacclabTensorOutput2D *)0x0;
  (this->super_Labeling)._vptr_Labeling = (_func_int **)&PTR__Labeling_003301b8;
  PerformanceEvaluator::PerformanceEvaluator(&(this->super_Labeling).perf_);
  (this->super_Labeling).input_._M_t.
  super___uniq_ptr_impl<YacclabTensorInput,_std::default_delete<YacclabTensorInput>_>._M_t.
  super__Tuple_impl<0UL,_YacclabTensorInput_*,_std::default_delete<YacclabTensorInput>_>.
  super__Head_base<0UL,_YacclabTensorInput_*,_false>._M_head_impl = pYVar1;
  (this->super_Labeling).output_._M_t.
  super___uniq_ptr_impl<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>._M_t.
  super__Tuple_impl<0UL,_YacclabTensorOutput_*,_std::default_delete<YacclabTensorOutput>_>.
  super__Head_base<0UL,_YacclabTensorOutput_*,_false>._M_head_impl =
       &pYVar2->super_YacclabTensorOutput;
  (this->super_Labeling)._vptr_Labeling = (_func_int **)&PTR__Labeling_00330148;
  plVar3 = (long *)__dynamic_cast(pYVar1,&YacclabTensorInput::typeinfo,
                                  &YacclabTensorInput2D::typeinfo,0);
  pMVar4 = (Mat1b *)(**(code **)(*plVar3 + 0x38))(plVar3);
  this->img_ = pMVar4;
  plVar3 = (long *)__dynamic_cast((this->super_Labeling).output_._M_t.
                                  super___uniq_ptr_impl<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_YacclabTensorOutput_*,_std::default_delete<YacclabTensorOutput>_>
                                  .super__Head_base<0UL,_YacclabTensorOutput_*,_false>._M_head_impl,
                                  &YacclabTensorOutput::typeinfo,&YacclabTensorOutput2D::typeinfo,0)
  ;
  pMVar5 = (Mat1i *)(**(code **)(*plVar3 + 0x48))(plVar3);
  this->img_labels_ = pMVar5;
  return;
}

Assistant:

Labeling2D(std::unique_ptr<YacclabTensorInput2D> input, std::unique_ptr<YacclabTensorOutput2D> output) :
        Labeling(std::move(input), std::move(output)),
        img_((dynamic_cast<YacclabTensorInput2D*>(input_.get()))->Raw()),
        img_labels_((dynamic_cast<YacclabTensorOutput2D*>(output_.get()))->Raw()) {}